

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O3

void __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::set
          (Parameter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data,vector<unsigned_long,_std::allocator<unsigned_long>_> *dimension)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer puVar4;
  bool bVar5;
  uint uVar6;
  range_error *this_00;
  pointer pcVar7;
  ulong uVar8;
  long lVar9;
  Parameter *pPVar10;
  Parameter *this_01;
  size_type *psVar11;
  size_t dataSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionCopy;
  size_t first_dim;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionWithStrLen;
  undefined1 local_68 [64];
  
  pPVar10 = (Parameter *)local_68;
  this_01 = (Parameter *)local_68;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = (pointer)0x0;
  if ((dimension->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (dimension->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_68._40_8_ =
         (long)(data->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(data->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,(iterator)0x0,
               (unsigned_long *)(local_68 + 0x28));
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,dimension);
    this_01 = pPVar10;
  }
  pbVar1 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  dataSize = (long)pbVar2 - (long)pbVar1 >> 5;
  bVar5 = isDimensionConsistent
                    (this_01,dataSize,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  if (bVar5) {
    local_68._32_8_ = (pointer)0x0;
    if (pbVar2 != pbVar1) {
      psVar11 = &pbVar1->_M_string_length;
      uVar6 = 1;
      pcVar7 = (pointer)0x0;
      do {
        pcVar3 = (pointer)*psVar11;
        if (pcVar7 < pcVar3) {
          pcVar7 = pcVar3;
          local_68._32_8_ = pcVar3;
        }
        uVar8 = (ulong)uVar6;
        psVar11 = psVar11 + 4;
        uVar6 = uVar6 + 1;
      } while (uVar8 < dataSize);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_68 + 0x28),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_68 + 0x28),
               (const_iterator)local_68._40_8_,(value_type_conflict3 *)(local_68 + 0x20));
    this->_data_type = CHAR;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->_param_data_string,data);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_dimension,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_68 + 0x28));
    puVar4 = (this->_dimension).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)(this->_dimension).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
    bVar5 = true;
    if ((lVar9 != 0) && ((lVar9 != 1 || (*puVar4 != 0)))) {
      bVar5 = false;
    }
    this->_isEmpty = bVar5;
    if ((unsigned_long *)local_68._40_8_ != (unsigned_long *)0x0) {
      operator_delete((void *)local_68._40_8_,local_68._56_8_ - local_68._40_8_);
    }
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
    }
    return;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error
            (this_00,"Dimension of the data does not correspond to sent dimensions");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void ezc3d::ParametersNS::GroupNS::Parameter::set(
    const std::vector<std::string> &data,
    const std::vector<size_t> &dimension) {
  std::vector<size_t> dimensionCopy;
  if (dimension.size() == 0) {
    dimensionCopy.push_back(data.size());
  } else {
    dimensionCopy = dimension;
  }
  if (!isDimensionConsistent(data.size(), dimensionCopy))
    throw std::range_error(
        "Dimension of the data does not correspond to sent dimensions");
  // Insert the length of the longest string
  size_t first_dim(0);
  for (unsigned int i = 0; i < data.size(); ++i)
    if (data[i].size() > first_dim)
      first_dim = data[i].size();
  std::vector<size_t> dimensionWithStrLen = dimensionCopy;
  dimensionWithStrLen.insert(dimensionWithStrLen.begin(), first_dim);

  _data_type = ezc3d::DATA_TYPE::CHAR;
  _param_data_string = data;
  _dimension = dimensionWithStrLen;
  setEmptyFlag();
}